

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::ScrollArea::setWidget(ScrollArea *this,QWidget *widget)

{
  ScrollIndicator *pSVar1;
  BlurEffect *pBVar2;
  bool bVar3;
  ScrollAreaPrivate *this_00;
  QWidget *pQVar4;
  ScrollAreaPrivate *d;
  QWidget *widget_local;
  ScrollArea *this_local;
  
  this_00 = d_func(this);
  bVar3 = ::operator==(widget,&this_00->widget);
  if ((!bVar3) && (widget != (QWidget *)0x0)) {
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horIndicator)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertIndicator)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horBlur)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertBlur)->super_QWidget);
    pQVar4 = QPointer::operator_cast_to_QWidget_((QPointer *)&this_00->widget);
    if (pQVar4 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar4 + 0x20))();
    }
    QPointer<QWidget>::operator=(&this_00->widget,(QWidget *)0x0);
    pQVar4 = QWidget::parentWidget(widget);
    if (pQVar4 != (this_00->super_AbstractScrollAreaPrivate).viewport) {
      QWidget::setParent(widget);
    }
    bVar3 = QWidget::testAttribute(widget,WA_Resized);
    if (!bVar3) {
      (**(code **)(*(long *)widget + 0x70))();
      QWidget::resize((QSize *)widget);
    }
    QPointer<QWidget>::operator=(&this_00->widget,widget);
    pSVar1 = (this_00->super_AbstractScrollAreaPrivate).horIndicator;
    QPointer::operator_cast_to_QWidget_((QPointer *)&this_00->widget);
    QWidget::setParent(&pSVar1->super_QWidget);
    QWidget::raise();
    pSVar1 = (this_00->super_AbstractScrollAreaPrivate).vertIndicator;
    QPointer::operator_cast_to_QWidget_((QPointer *)&this_00->widget);
    QWidget::setParent(&pSVar1->super_QWidget);
    QWidget::raise();
    pBVar2 = (this_00->super_AbstractScrollAreaPrivate).horBlur;
    QPointer::operator_cast_to_QWidget_((QPointer *)&this_00->widget);
    QWidget::setParent(&pBVar2->super_QWidget);
    pBVar2 = (this_00->super_AbstractScrollAreaPrivate).vertBlur;
    QPointer::operator_cast_to_QWidget_((QPointer *)&this_00->widget);
    QWidget::setParent(&pBVar2->super_QWidget);
    pQVar4 = QPointer<QWidget>::operator->(&this_00->widget);
    QWidget::setAutoFillBackground(SUB81(pQVar4,0));
    QObject::installEventFilter((QObject *)widget);
    ScrollAreaPrivate::updateScrolledSize(this_00);
    QPointer<QWidget>::operator->(&this_00->widget);
    QWidget::show();
  }
  return;
}

Assistant:

void
ScrollArea::setWidget( QWidget * widget )
{
	ScrollAreaPrivate * d = d_func();

	if( widget == d->widget || !widget )
		return;

	d->horIndicator->setParent( 0 );
	d->vertIndicator->setParent( 0 );
	d->horBlur->setParent( 0 );
	d->vertBlur->setParent( 0 );
	delete d->widget;
	d->widget = 0;
	if( widget->parentWidget() != d->viewport )
		widget->setParent( d->viewport );
	if( !widget->testAttribute( Qt::WA_Resized ) )
		widget->resize( widget->sizeHint() );
	d->widget = widget;
	d->horIndicator->setParent( d->widget );
	d->horIndicator->raise();
	d->vertIndicator->setParent( d->widget );
	d->vertIndicator->raise();
	d->horBlur->setParent( d->widget );
	d->vertBlur->setParent( d->widget );
	d->widget->setAutoFillBackground( true );
	widget->installEventFilter( this );
	d->updateScrolledSize();
	d->widget->show();
}